

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrix.hpp
# Opt level: O2

Vector<float,_4> __thiscall tcu::operator*(tcu *this,Vector<float,_2> *vec,Matrix<float,_2,_4> *mtx)

{
  int col;
  long lVar1;
  int row;
  long lVar2;
  float v;
  ulong extraout_XMM0_Qa;
  ulong uVar3;
  float fVar4;
  ulong in_XMM1_Qa;
  Vector<float,_4> VVar5;
  
  Vector<float,_4>::Vector((Vector<float,_4> *)this);
  uVar3 = extraout_XMM0_Qa;
  for (lVar1 = 0; lVar1 != 4; lVar1 = lVar1 + 1) {
    uVar3 = 0;
    for (lVar2 = 0; lVar2 != 2; lVar2 = lVar2 + 1) {
      fVar4 = ((Vector<tcu::Vector<float,_2>,_4> *)((Vector<float,_2> *)mtx)->m_data)->m_data[0].
              m_data[lVar2] * vec->m_data[lVar2];
      in_XMM1_Qa = (ulong)(uint)fVar4;
      uVar3 = (ulong)(uint)((float)uVar3 + fVar4);
    }
    *(float *)(this + lVar1 * 4) = (float)uVar3;
    mtx = (Matrix<float,_2,_4> *)((long)mtx + 8);
  }
  VVar5.m_data[2] = (float)(int)in_XMM1_Qa;
  VVar5.m_data[3] = (float)(int)(in_XMM1_Qa >> 0x20);
  VVar5.m_data[0] = (float)(int)uVar3;
  VVar5.m_data[1] = (float)(int)(uVar3 >> 0x20);
  return (Vector<float,_4>)VVar5.m_data;
}

Assistant:

Vector<T, Cols> operator* (const Vector<T, Rows>& vec, const Matrix<T, Rows, Cols>& mtx)
{
	Vector<T, Cols> res;
	for (int col = 0; col < Cols; col++)
	{
		T v = T(0);
		for (int row = 0; row < Rows; row++)
			v += mtx(row,col) * vec.m_data[row];
		res.m_data[col] = v;
	}
	return res;
}